

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall google::protobuf::descriptor_unittest::HasHasbitTest::SetUp(HasHasbitTest *this)

{
  ParamType *pPVar1;
  FileDescriptor *pFVar2;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  pPVar1 = testing::WithParamInterface<google::protobuf::descriptor_unittest::HasHasbitTestParam>::
           GetParam();
  input._M_str = (char *)&this->foo_proto_;
  input._M_len = (size_t)(pPVar1->input_foo_proto)._M_dataplus._M_p;
  local_40[0] = (internal)
                TextFormat::ParseFromString
                          ((TextFormat *)(pPVar1->input_foo_proto)._M_string_length,input,in_RCX);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_40[0]) {
    pFVar2 = DescriptorPool::BuildFile(&this->pool_,&this->foo_proto_);
    this->foo_ = pFVar2;
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_)","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xc84,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    ASSERT_TRUE(
        TextFormat::ParseFromString(GetParam().input_foo_proto, &foo_proto_));
    foo_ = pool_.BuildFile(foo_proto_);
  }